

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O1

int processPic(istream *in,path *output)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t offset;
  bool bVar3;
  char cVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  char cVar8;
  ulong __val;
  string __str;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  PicHeader header;
  Image result;
  string local_138;
  long *local_118;
  uint local_110;
  long local_108 [2];
  vector<MaskRect,_std::allocator<MaskRect>_> local_f8;
  Image local_d8;
  path *local_b0;
  istream *local_a8;
  pointer local_a0;
  PicHeader local_98;
  Image local_68;
  vector<MaskRect,_std::allocator<MaskRect>_> local_48;
  
  local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = in;
  operator>>(in,&local_98);
  local_68.size = (Size)((ulong)local_98.width + ((ulong)local_98.height << 0x20));
  local_d8.size = (Size)((ulong)(uint)local_d8.size.height << 0x20);
  local_b0 = output;
  std::vector<Color,_std::allocator<Color>_>::vector
            (&local_68.colorData,(long)(int)((uint)local_98.width * (uint)local_98.height),
             (value_type *)&local_d8,(allocator_type *)&local_138);
  local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.size.width = 0;
  local_d8.size.height = 0;
  local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __val = 0;
    do {
      cVar8 = '\x01';
      if (9 < __val) {
        uVar6 = __val;
        cVar4 = '\x04';
        do {
          cVar8 = cVar4;
          if (uVar6 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_0010d4d0;
          }
          if (uVar6 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_0010d4d0;
          }
          if (uVar6 < 10000) goto LAB_0010d4d0;
          bVar3 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar4 = cVar8 + '\x04';
        } while (bVar3);
        cVar8 = cVar8 + '\x01';
      }
LAB_0010d4d0:
      local_a0 = local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                 super__Vector_impl_data._M_start;
      offset = local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
               super__Vector_impl_data._M_start[__val].offset;
      local_118 = local_108;
      std::__cxx11::string::_M_construct((ulong)&local_118,cVar8);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118,local_110,__val);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x116820);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138.field_2._8_8_ = plVar5[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      processChunk(&local_d8,&local_f8,offset,local_a8,&local_138,local_98.isSwitch);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_118 != local_108) {
        operator_delete(local_118,local_108[0] + 1);
      }
      uVar1 = local_a0[__val].x;
      uVar2 = local_a0[__val].y;
      std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_48,&local_f8);
      Image::drawOnto(&local_d8,&local_68,(Point)((ulong)uVar2 << 0x20 | (ulong)uVar1),&local_48);
      if (local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      __val = __val + 1;
    } while (__val < (ulong)(((long)local_98.chunks.
                                    super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_98.chunks.
                                    super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2) * -0x5555555555555555));
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  Image::writePNG(&local_68,local_b0,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int processPic(std::istream &in, const fs::path &output) {
	PicHeader header;
	in >> header;

	Image result({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for(size_t i = 0; i < header.chunks.size(); i++) {
		const auto &chunk = header.chunks[i];
		processChunk(currentChunk, maskData, chunk.offset, in, "chunk" + std::to_string(i), header.isSwitch);
		currentChunk.drawOnto(result, {chunk.x, chunk.y}, maskData);
	}

	result.writePNG(output);
	return 0;
}